

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFromIntoUninitializedExtension
          (ExtensionSet *this,Extension *dst_extension,MessageLite *extendee,int number,
          Extension *other_extension,Arena *other_arena)

{
  bool bVar1;
  undefined1 uVar2;
  bool bVar3;
  TrivialAtomicInt TVar4;
  CppType CVar5;
  int64_t iVar6;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar7;
  Arena *other_arena_local;
  Extension *other_extension_local;
  int number_local;
  MessageLite *extendee_local;
  Extension *dst_extension_local;
  ExtensionSet *this_local;
  
  dst_extension->field_0 = other_extension->field_0;
  bVar1 = other_extension->is_repeated;
  uVar2 = other_extension->field_0xa;
  bVar3 = other_extension->is_packed;
  TVar4.int_ = (other_extension->cached_size).int_[0];
  dst_extension->type = other_extension->type;
  dst_extension->is_repeated = bVar1;
  dst_extension->field_0xa = uVar2;
  dst_extension->is_packed = bVar3;
  dst_extension->cached_size = (TrivialAtomicInt)TVar4.int_;
  dst_extension->descriptor = other_extension->descriptor;
  if ((other_extension->is_repeated & 1U) == 0) {
    CVar5 = anon_unknown_59::cpp_type(other_extension->type);
    if (7 < CVar5 - CPPTYPE_INT32) {
      if (CVar5 == CPPTYPE_STRING) {
        aVar7.int64_t_value =
             (int64_t)Arena::Create<std::__cxx11::string,std::__cxx11::string&>
                                (this->arena_,other_extension->field_0);
        dst_extension->field_0 = aVar7;
      }
      else if (CVar5 == CPPTYPE_MESSAGE) {
        if (((byte)other_extension->field_0xa >> 2 & 1) == 0) {
          aVar7.int64_t_value = (int64_t)MessageLite::New(other_extension->field_0,this->arena_);
          dst_extension->field_0 = aVar7;
          MessageLite::CheckTypeAndMergeFrom
                    ((MessageLite *)dst_extension->field_0,(MessageLite *)other_extension->field_0);
        }
        else {
          iVar6 = (**(code **)(**(long **)&(other_extension->field_0).int32_t_value + 0x10))
                            (*(long **)&(other_extension->field_0).int32_t_value,this->arena_,
                             (other_extension->field_0).int64_t_value,other_arena);
          (dst_extension->field_0).int64_t_value = iVar6;
        }
      }
    }
  }
  else {
    CVar5 = anon_unknown_59::cpp_type(other_extension->type);
    switch(CVar5) {
    case CPPTYPE_INT32:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<int>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<int>::MergeFrom
                ((RepeatedField<int> *)dst_extension->field_0,
                 (RepeatedField<int> *)other_extension->field_0);
      break;
    case CPPTYPE_INT64:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<long>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<long>::MergeFrom
                ((RepeatedField<long> *)dst_extension->field_0,
                 (RepeatedField<long> *)other_extension->field_0);
      break;
    case CPPTYPE_UINT32:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<unsigned_int>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<unsigned_int>::MergeFrom
                ((RepeatedField<unsigned_int> *)dst_extension->field_0,
                 (RepeatedField<unsigned_int> *)other_extension->field_0);
      break;
    case CPPTYPE_UINT64:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<unsigned_long>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<unsigned_long>::MergeFrom
                ((RepeatedField<unsigned_long> *)dst_extension->field_0,
                 (RepeatedField<unsigned_long> *)other_extension->field_0);
      break;
    case CPPTYPE_DOUBLE:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<double>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<double>::MergeFrom
                ((RepeatedField<double> *)dst_extension->field_0,
                 (RepeatedField<double> *)other_extension->field_0);
      break;
    case CPPTYPE_FLOAT:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<float>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<float>::MergeFrom
                ((RepeatedField<float> *)dst_extension->field_0,
                 (RepeatedField<float> *)other_extension->field_0);
      break;
    case CPPTYPE_BOOL:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<bool>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<bool>::MergeFrom
                ((RepeatedField<bool> *)dst_extension->field_0,
                 (RepeatedField<bool> *)other_extension->field_0);
      break;
    case CPPTYPE_ENUM:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<int>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedField<int>::MergeFrom
                ((RepeatedField<int> *)dst_extension->field_0,
                 (RepeatedField<int> *)other_extension->field_0);
      break;
    case CPPTYPE_STRING:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)dst_extension->field_0,
                  (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)other_extension->field_0);
      break;
    case CPPTYPE_MESSAGE:
      aVar7 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                        (this->arena_);
      dst_extension->field_0 = aVar7;
      RepeatedPtrField<google::protobuf::MessageLite>::MergeFrom
                ((RepeatedPtrField<google::protobuf::MessageLite> *)dst_extension->field_0,
                 (RepeatedPtrField<google::protobuf::MessageLite> *)other_extension->field_0);
    }
  }
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFromIntoUninitializedExtension(
    Extension& dst_extension, const MessageLite* extendee, int number,
    const Extension& other_extension, Arena* other_arena) {
  // Copy and initialize all the fields.
  // We fix up incorrect pointers later.
  // Primitive values are copied here.
  dst_extension = other_extension;

  if (other_extension.is_repeated) {
    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE)       \
  case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
    dst_extension.ptr.repeated_##LOWERCASE##_value =           \
        Arena::Create<REPEATED_TYPE>(arena_);                  \
    dst_extension.ptr.repeated_##LOWERCASE##_value->MergeFrom( \
        *other_extension.ptr.repeated_##LOWERCASE##_value);    \
    break;

      HANDLE_TYPE(INT32, int32_t, RepeatedField<int32_t>);
      HANDLE_TYPE(INT64, int64_t, RepeatedField<int64_t>);
      HANDLE_TYPE(UINT32, uint32_t, RepeatedField<uint32_t>);
      HANDLE_TYPE(UINT64, uint64_t, RepeatedField<uint64_t>);
      HANDLE_TYPE(FLOAT, float, RepeatedField<float>);
      HANDLE_TYPE(DOUBLE, double, RepeatedField<double>);
      HANDLE_TYPE(BOOL, bool, RepeatedField<bool>);
      HANDLE_TYPE(ENUM, enum, RepeatedField<int>);
      HANDLE_TYPE(STRING, string, RepeatedPtrField<std::string>);
      HANDLE_TYPE(MESSAGE, message, RepeatedPtrField<MessageLite>);
#undef HANDLE_TYPE
    }
    return;
  }

  // Non-repeated extension
  switch (cpp_type(other_extension.type)) {
    case WireFormatLite::CPPTYPE_INT32:
    case WireFormatLite::CPPTYPE_INT64:
    case WireFormatLite::CPPTYPE_UINT32:
    case WireFormatLite::CPPTYPE_UINT64:
    case WireFormatLite::CPPTYPE_FLOAT:
    case WireFormatLite::CPPTYPE_DOUBLE:
    case WireFormatLite::CPPTYPE_BOOL:
    case WireFormatLite::CPPTYPE_ENUM:
      break;  // Do nothing.
    case WireFormatLite::CPPTYPE_STRING:
      dst_extension.ptr.string_value =
          Arena::Create<std::string>(arena_, *other_extension.ptr.string_value);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE: {
      if (other_extension.is_lazy) {
        dst_extension.ptr.lazymessage_value =
            other_extension.ptr.lazymessage_value->Clone(
                arena_, *other_extension.ptr.lazymessage_value, other_arena);
      } else {
        dst_extension.ptr.message_value =
            other_extension.ptr.message_value->New(arena_);
        dst_extension.ptr.message_value->CheckTypeAndMergeFrom(
            *other_extension.ptr.message_value);
      }
      break;
    }
  }
}